

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

WeierstrassPoint * ecc_weierstrass_add(WeierstrassPoint *P,WeierstrassPoint *Q)

{
  WeierstrassCurve *pWVar1;
  uint uVar2;
  WeierstrassPoint *out;
  mp_int *lambda_d;
  mp_int *denom;
  mp_int *Qx;
  mp_int *Py;
  mp_int *Px;
  mp_int *lambda_n;
  
  pWVar1 = P->wc;
  if (Q->wc != pWVar1) {
    __assert_fail("Q->wc == wc",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                  ,0x12f,
                  "WeierstrassPoint *ecc_weierstrass_add(WeierstrassPoint *, WeierstrassPoint *)");
  }
  out = (WeierstrassPoint *)safemalloc(1,0x20,0);
  out->wc = pWVar1;
  out->X = (mp_int *)0x0;
  out->Y = (mp_int *)0x0;
  out->Z = (mp_int *)0x0;
  ecc_weierstrass_add_prologue(P,Q,&Px,&Py,&Qx,&denom,&lambda_n,&lambda_d);
  uVar2 = mp_eq_integer(lambda_n,0);
  if (uVar2 == 0) {
    ecc_weierstrass_epilogue(Px,Qx,Py,denom,lambda_n,lambda_d,out);
    mp_free(Px);
    mp_free(Py);
    mp_free(Qx);
    mp_free(denom);
    mp_free(lambda_n);
    mp_free(lambda_d);
    return out;
  }
  __assert_fail("!mp_eq_integer(lambda_n, 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x13b,
                "WeierstrassPoint *ecc_weierstrass_add(WeierstrassPoint *, WeierstrassPoint *)");
}

Assistant:

WeierstrassPoint *ecc_weierstrass_add(WeierstrassPoint *P, WeierstrassPoint *Q)
{
    WeierstrassCurve *wc = P->wc;
    assert(Q->wc == wc);

    WeierstrassPoint *S = ecc_weierstrass_point_new_empty(wc);

    mp_int *Px, *Py, *Qx, *denom, *lambda_n, *lambda_d;
    ecc_weierstrass_add_prologue(
        P, Q, &Px, &Py, &Qx, &denom, &lambda_n, &lambda_d);

    /* Never expect to have received two mutually inverse inputs, or
     * two identical ones (which would make this a doubling). In other
     * words, the two input x-coordinates (after putting over a common
     * denominator) should never have been equal. */
    assert(!mp_eq_integer(lambda_n, 0));

    /* Now go to the common epilogue code. */
    ecc_weierstrass_epilogue(Px, Qx, Py, denom, lambda_n, lambda_d, S);

    mp_free(Px);
    mp_free(Py);
    mp_free(Qx);
    mp_free(denom);
    mp_free(lambda_n);
    mp_free(lambda_d);

    return S;
}